

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTestsNamesOnly(Config *config)

{
  bool bVar1;
  int iVar2;
  reference pTVar3;
  ostream *poVar4;
  long *in_RDI;
  TestCase *testCaseInfo;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  size_t matchedTests;
  TestSpec *testSpec;
  SourceLineInfo *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  ostream *in_stack_ffffffffffffff70;
  IConfig *in_stack_ffffffffffffffa8;
  TestSpec *in_stack_ffffffffffffffb0;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [24];
  size_t local_18;
  undefined8 local_10;
  long *local_8;
  
  local_8 = in_RDI;
  local_10 = (**(code **)(*in_RDI + 0x68))();
  local_18 = 0;
  getAllTestCasesSorted((IConfig *)0x2342fe);
  filterTests(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_38 = local_30;
  local_40._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  in_stack_ffffffffffffff58);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_ffffffffffffff58)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    pTVar3 = __gnu_cxx::
             __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&local_40);
    local_18 = local_18 + 1;
    bVar1 = startsWith(in_stack_ffffffffffffff60,(char)((ulong)in_stack_ffffffffffffff58 >> 0x38));
    if (bVar1) {
      poVar4 = cout();
      poVar4 = std::operator<<(poVar4,'\"');
      poVar4 = std::operator<<(poVar4,(string *)pTVar3);
      std::operator<<(poVar4,'\"');
    }
    else {
      poVar4 = cout();
      std::operator<<(poVar4,(string *)pTVar3);
    }
    iVar2 = (**(code **)(*local_8 + 0xa0))();
    if (1 < iVar2) {
      in_stack_ffffffffffffff70 = cout();
      std::operator<<(in_stack_ffffffffffffff70,"\t@");
      operator<<((ostream *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    in_stack_ffffffffffffff60 = (string *)cout();
    std::ostream::operator<<(in_stack_ffffffffffffff60,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_40);
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_ffffffffffffff70)
  ;
  return local_18;
}

Assistant:

std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            matchedTests++;
            if( startsWith( testCaseInfo.name, '#' ) )
               Catch::cout() << '"' << testCaseInfo.name << '"';
            else
               Catch::cout() << testCaseInfo.name;
            if ( config.verbosity() >= Verbosity::High )
                Catch::cout() << "\t@" << testCaseInfo.lineInfo;
            Catch::cout() << std::endl;
        }
        return matchedTests;
    }